

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O0

void Llb_ManResultPrint(Aig_Man_t *p,Vec_Ptr_t *vResult)

{
  int iVar1;
  Vec_Ptr_t *vLower_00;
  undefined4 local_2c;
  Vec_Ptr_t *pVStack_28;
  int i;
  Vec_Ptr_t *vUpper;
  Vec_Ptr_t *vLower;
  Vec_Ptr_t *vResult_local;
  Aig_Man_t *p_local;
  
  pVStack_28 = (Vec_Ptr_t *)0x0;
  local_2c = Vec_PtrSize(vResult);
  vLower_00 = pVStack_28;
  while (pVStack_28 = vLower_00, local_2c = local_2c + -1, -1 < local_2c) {
    vLower_00 = (Vec_Ptr_t *)Vec_PtrEntry(vResult,local_2c);
    iVar1 = Vec_PtrSize(vResult);
    if (local_2c < iVar1 + -1) {
      Llb_ManCutPrint(p,vLower_00,pVStack_28);
    }
  }
  return;
}

Assistant:

void Llb_ManResultPrint( Aig_Man_t * p, Vec_Ptr_t * vResult )
{
    Vec_Ptr_t * vLower, * vUpper = NULL;
    int i;
    Vec_PtrForEachEntryReverse( Vec_Ptr_t *, vResult, vLower, i )
    {
        if ( i < Vec_PtrSize(vResult) - 1 )
            Llb_ManCutPrint( p, vLower, vUpper );
        vUpper = vLower;
    }
}